

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

void __thiscall
GlobOpt::GenerateSecondaryInductionVariableBound
          (GlobOpt *this,Loop *loop,StackSym *inductionVariableSym,LoopCount *loopCount,
          int maxMagnitudeChange,bool needsMagnitudeAdjustment,StackSym *boundSym)

{
  BailOutInfo *bailOutInfo_00;
  Instr *instr_00;
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  IntConstOpnd *newSrc;
  BailOutInstrTemplate<IR::Instr> *pBVar6;
  RegOpnd *pRVar7;
  Opnd *pOVar8;
  BailOutInstr *instr_1;
  BailOutInstr *instr;
  StackSym *intermediateValueSym;
  StackSym *loopCountSym;
  Func *func;
  Instr *insertBeforeInstr;
  BailOutKind bailOutKind;
  BailOutInfo *bailOutInfo;
  bool needsMagnitudeAdjustment_local;
  int maxMagnitudeChange_local;
  LoopCount *loopCount_local;
  StackSym *inductionVariableSym_local;
  Loop *loop_local;
  GlobOpt *this_local;
  
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x73e,"(loop)","loop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (inductionVariableSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x73f,"(inductionVariableSym)","inductionVariableSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IVar3 = StackSym::GetType(inductionVariableSym);
  if (IVar3 != TyInt32) {
    IVar3 = StackSym::GetType(inductionVariableSym);
    if (IVar3 != TyUint32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x740,
                         "(inductionVariableSym->GetType() == TyInt32 || inductionVariableSym->GetType() == TyUint32)"
                         ,
                         "inductionVariableSym->GetType() == TyInt32 || inductionVariableSym->GetType() == TyUint32"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  if (loopCount == (LoopCount *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x741,"(loopCount)","loopCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (loopCount != loop->loopCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x742,"(loopCount == loop->loopCount)","loopCount == loop->loopCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = LoopCount::LoopCountMinusOneSym(loopCount);
  if (pSVar5 == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x743,"(loopCount->LoopCountMinusOneSym())",
                       "loopCount->LoopCountMinusOneSym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (maxMagnitudeChange == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x744,"(maxMagnitudeChange != 0)","maxMagnitudeChange != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (maxMagnitudeChange < -0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x745,
                       "(maxMagnitudeChange >= -InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting)"
                       ,
                       "maxMagnitudeChange >= -InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (0x10000 < maxMagnitudeChange) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x746,
                       "(maxMagnitudeChange <= InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting)"
                       ,
                       "maxMagnitudeChange <= InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (boundSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x747,"(boundSym)","boundSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = StackSym::IsInt32(boundSym);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x748,"(boundSym->IsInt32())","boundSym->IsInt32()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bailOutInfo_00 = loop->bailOutInfo;
  if (bailOutInfo_00 == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x74e,"(bailOutInfo)","bailOutInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  instr_00 = bailOutInfo_00->bailOutInstr;
  if (instr_00 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x751,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  func_00 = bailOutInfo_00->bailOutFunc;
  if (needsMagnitudeAdjustment) {
    GenerateLoopCountPlusOne(this,loop,loopCount);
    intermediateValueSym = LoopCount::LoopCountSym(loopCount);
  }
  else {
    intermediateValueSym = LoopCount::LoopCountMinusOneSym(loopCount);
  }
  if ((maxMagnitudeChange == 1) || (maxMagnitudeChange == -1)) {
    instr = (BailOutInstr *)intermediateValueSym;
  }
  else {
    pBVar6 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Mul_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo_00,func_00
                       );
    IVar3 = StackSym::GetType(intermediateValueSym);
    pRVar7 = IR::RegOpnd::New(intermediateValueSym,IVar3,func_00);
    IR::Instr::SetSrc1(&pBVar6->super_Instr,&pRVar7->super_Opnd);
    pOVar8 = IR::Instr::GetSrc1(&pBVar6->super_Instr);
    IR::Opnd::SetIsJITOptimizedReg(pOVar8,true);
    newSrc = IR::IntConstOpnd::New((long)maxMagnitudeChange,TyInt32,func_00,true);
    IR::Instr::SetSrc2(&pBVar6->super_Instr,&newSrc->super_Opnd);
    instr = (BailOutInstr *)boundSym;
    IVar3 = StackSym::GetType(boundSym);
    pRVar7 = IR::RegOpnd::New(boundSym,IVar3,func_00);
    IR::Instr::SetDst(&pBVar6->super_Instr,&pRVar7->super_Opnd);
    pOVar8 = IR::Instr::GetDst(&pBVar6->super_Instr);
    IR::Opnd::SetIsJITOptimizedReg(pOVar8,true);
    IR::Instr::SetByteCodeOffset(&pBVar6->super_Instr,instr_00);
    IR::Instr::InsertBefore(instr_00,&pBVar6->super_Instr);
  }
  pBVar6 = IR::BailOutInstrTemplate<IR::Instr>::New
                     (Add_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo_00,func_00);
  IVar3 = StackSym::GetType((StackSym *)instr);
  pRVar7 = IR::RegOpnd::New((StackSym *)instr,IVar3,func_00);
  IR::Instr::SetSrc1(&pBVar6->super_Instr,&pRVar7->super_Opnd);
  pOVar8 = IR::Instr::GetSrc1(&pBVar6->super_Instr);
  IR::Opnd::SetIsJITOptimizedReg(pOVar8,true);
  IVar3 = StackSym::GetType(inductionVariableSym);
  pRVar7 = IR::RegOpnd::New(inductionVariableSym,IVar3,func_00);
  IR::Instr::SetSrc2(&pBVar6->super_Instr,&pRVar7->super_Opnd);
  pOVar8 = IR::Instr::GetSrc2(&pBVar6->super_Instr);
  IR::Opnd::SetIsJITOptimizedReg(pOVar8,true);
  if (maxMagnitudeChange == -1) {
    (pBVar6->super_Instr).m_opcode = Sub_I4;
    IR::Instr::SwapOpnds(&pBVar6->super_Instr);
  }
  IVar3 = StackSym::GetType(boundSym);
  pRVar7 = IR::RegOpnd::New(boundSym,IVar3,func_00);
  IR::Instr::SetDst(&pBVar6->super_Instr,&pRVar7->super_Opnd);
  pOVar8 = IR::Instr::GetDst(&pBVar6->super_Instr);
  IR::Opnd::SetIsJITOptimizedReg(pOVar8,true);
  IR::Instr::SetByteCodeOffset(&pBVar6->super_Instr,instr_00);
  IR::Instr::InsertBefore(instr_00,&pBVar6->super_Instr);
  return;
}

Assistant:

void GlobOpt::GenerateSecondaryInductionVariableBound(
    Loop *const loop,
    StackSym *const inductionVariableSym,
    LoopCount *const loopCount,
    const int maxMagnitudeChange,
    const bool needsMagnitudeAdjustment,
    StackSym *const boundSym)
{
    Assert(loop);
    Assert(inductionVariableSym);
    Assert(inductionVariableSym->GetType() == TyInt32 || inductionVariableSym->GetType() == TyUint32);
    Assert(loopCount);
    Assert(loopCount == loop->loopCount);
    Assert(loopCount->LoopCountMinusOneSym());
    Assert(maxMagnitudeChange != 0);
    Assert(maxMagnitudeChange >= -InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting);
    Assert(maxMagnitudeChange <= InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting);
    Assert(boundSym);
    Assert(boundSym->IsInt32());

    // bound = inductionVariable + loopCountMinusOne * maxMagnitudeChange

    // Prepare the landing pad for bailouts and instruction insertion
    BailOutInfo *const bailOutInfo = loop->bailOutInfo;
    Assert(bailOutInfo);
    const IR::BailOutKind bailOutKind = IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck;
    IR::Instr *const insertBeforeInstr = bailOutInfo->bailOutInstr;
    Assert(insertBeforeInstr);
    Func *const func = bailOutInfo->bailOutFunc;

    StackSym* loopCountSym = nullptr;

    // If indexOffset < maxMagnitudeChange, we need to account for the difference between them in the bound check
    // i.e. BoundCheck: inductionVariable + loopCountMinusOne * maxMagnitudeChange + maxMagnitudeChange - indexOffset <= length - offset
    // Since the BoundCheck instruction already deals with offset, we can simplify this to
    // BoundCheck: inductionVariable + loopCount * maxMagnitudeChange <= length + indexOffset - offset
    if (needsMagnitudeAdjustment)
    {
        GenerateLoopCountPlusOne(loop, loopCount);
        loopCountSym = loopCount->LoopCountSym();
    }
    else
    {
        loopCountSym = loopCount->LoopCountMinusOneSym();
    }
    // intermediateValue = loopCount * maxMagnitudeChange
    StackSym *intermediateValueSym;
    if(maxMagnitudeChange == 1 || maxMagnitudeChange == -1)
    {
        intermediateValueSym = loopCountSym;
    }
    else
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Mul_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc1(
            IR::RegOpnd::New(loopCountSym, loopCountSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        instr->SetSrc2(IR::IntConstOpnd::New(maxMagnitudeChange, TyInt32, func, true));

        intermediateValueSym = boundSym;
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }

    // bound = intermediateValue + inductionVariable
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Add_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        instr->SetSrc2(IR::RegOpnd::New(inductionVariableSym, inductionVariableSym->GetType(), func));
        instr->GetSrc2()->SetIsJITOptimizedReg(true);

        if(maxMagnitudeChange == -1)
        {
            // bound = inductionVariable - intermediateValue[loopCount]
            instr->m_opcode = Js::OpCode::Sub_I4;
            instr->SwapOpnds();
        }

        instr->SetDst(IR::RegOpnd::New(boundSym, boundSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
}